

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

RecyclableObject *
Js::JavascriptOperators::SpeciesConstructor
          (RecyclableObject *object,JavascriptFunction *defaultConstructor,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *instance;
  RecyclableObject *local_50;
  RecyclableObject *constructorObj;
  Var species;
  Var constructor;
  ScriptContext *scriptContext_local;
  JavascriptFunction *defaultConstructor_local;
  RecyclableObject *object_local;
  RecyclableObject *local_10;
  
  constructor = scriptContext;
  scriptContext_local = (ScriptContext *)defaultConstructor;
  defaultConstructor_local = (JavascriptFunction *)object;
  BVar3 = IsObject(object);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2995,"(JavascriptOperators::IsObject(object))",
                                "JavascriptOperators::IsObject(object)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  species = GetProperty((RecyclableObject *)defaultConstructor_local,0x67,
                        (ScriptContext *)constructor,(PropertyValueInfo *)0x0);
  BVar3 = IsUndefinedObject(species);
  if (BVar3 == 0) {
    BVar3 = IsObject(species);
    if (BVar3 == 0) {
      JavascriptError::ThrowTypeError((ScriptContext *)constructor,-0x7ff5ec71,L"[constructor]");
    }
    constructorObj = (RecyclableObject *)0x0;
    instance = VarTo<Js::RecyclableObject>(species);
    BVar3 = GetProperty(instance,0x19,&constructorObj,(ScriptContext *)constructor,
                        (PropertyValueInfo *)0x0);
    if ((BVar3 == 0) || (BVar3 = IsUndefinedOrNull(constructorObj), BVar3 != 0)) {
      object_local = (RecyclableObject *)scriptContext_local;
    }
    else {
      species = constructorObj;
      local_10 = constructorObj;
      bVar2 = VarIs<Js::RecyclableObject>(constructorObj);
      if (bVar2) {
        local_50 = UnsafeVarTo<Js::RecyclableObject>(local_10);
      }
      else {
        local_50 = (RecyclableObject *)0x0;
      }
      if ((local_50 == (RecyclableObject *)0x0) || (bVar2 = IsConstructor(local_50), !bVar2)) {
        JavascriptError::ThrowTypeError
                  ((ScriptContext *)constructor,-0x7ff5ec00,L"constructor[Symbol.species]");
      }
      object_local = local_50;
    }
  }
  else {
    object_local = (RecyclableObject *)scriptContext_local;
  }
  return object_local;
}

Assistant:

RecyclableObject* JavascriptOperators::SpeciesConstructor(_In_ RecyclableObject* object, _In_ JavascriptFunction* defaultConstructor, _In_ ScriptContext* scriptContext)
    {
        //1.Assert: Type(O) is Object.
        Assert(JavascriptOperators::IsObject(object));

        //2.Let C be Get(O, "constructor").
        //3.ReturnIfAbrupt(C).
        Var constructor = JavascriptOperators::GetProperty(object, PropertyIds::constructor, scriptContext);

        //4.If C is undefined, return defaultConstructor.
        if (JavascriptOperators::IsUndefinedObject(constructor))
        {
            return defaultConstructor;
        }
        //5.If Type(C) is not Object, throw a TypeError exception.
        if (!JavascriptOperators::IsObject(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject, _u("[constructor]"));
        }
        //6.Let S be Get(C, @@species).
        //7.ReturnIfAbrupt(S).
        Var species = nullptr;
        if (!JavascriptOperators::GetProperty(VarTo<RecyclableObject>(constructor),
            PropertyIds::_symbolSpecies, &species, scriptContext)
            || JavascriptOperators::IsUndefinedOrNull(species))
        {
            //8.If S is either undefined or null, return defaultConstructor.
            return defaultConstructor;
        }
        constructor = species;

        //9.If IsConstructor(S) is true, return S.
        RecyclableObject* constructorObj = JavascriptOperators::TryFromVar<RecyclableObject>(constructor);
        if (constructorObj && JavascriptOperators::IsConstructor(constructorObj))
        {
            return constructorObj;
        }
        //10.Throw a TypeError exception.
        JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor, _u("constructor[Symbol.species]"));
    }